

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_expression.cpp
# Opt level: O1

FxExpression * __thiscall FxBoolCast::Resolve(FxBoolCast *this,FCompileContext *ctx)

{
  PType *pPVar1;
  PString *pPVar2;
  PBool *pPVar3;
  int iVar4;
  undefined4 extraout_var;
  FxExpression *pFVar5;
  uint uVar6;
  FxExpression *x;
  FxBoolCast *pFVar7;
  ExpVal constval;
  FString local_30;
  
  if ((this->super_FxExpression).isresolved == false) {
    (this->super_FxExpression).isresolved = true;
    if (this->basex != (FxExpression *)0x0) {
      iVar4 = (*this->basex->_vptr_FxExpression[2])();
      this->basex = (FxExpression *)CONCAT44(extraout_var,iVar4);
    }
    pFVar7 = (FxBoolCast *)this->basex;
    if (pFVar7 == (FxBoolCast *)0x0) {
      (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
      this = (FxBoolCast *)0x0;
    }
    else {
      pPVar1 = (pFVar7->super_FxExpression).ValueType;
      if (pPVar1 == (PType *)TypeBool) {
        this->basex = (FxExpression *)0x0;
      }
      else {
        iVar4 = (**(code **)(*(long *)&pPVar1->super_DObject + 0x90))();
        if (((iVar4 == 0) ||
            (iVar4 = (*(this->basex->ValueType->super_DObject)._vptr_DObject[0x12])(), iVar4 == 1))
           || (iVar4 = (*(this->basex->ValueType->super_DObject)._vptr_DObject[0x12])(), iVar4 == 3)
           ) {
          iVar4 = (*this->basex->_vptr_FxExpression[3])();
          if ((char)iVar4 == '\0') {
            return &this->super_FxExpression;
          }
          pFVar5 = this->basex;
          if (pFVar5->ValueType != (PType *)TypeState) {
            pPVar2 = (PString *)pFVar5[1]._vptr_FxExpression;
            if (pPVar2 == TypeString) {
              FString::AttachToOther(&local_30,(FString *)&pFVar5[1].JumpAddresses);
            }
            else {
              local_30.Chars = (char *)pFVar5[1].JumpAddresses.Array;
            }
            pFVar5 = (FxExpression *)operator_new(0x48);
            iVar4 = (*(pPVar2->super_PBasicType).super_PType.super_DObject._vptr_DObject[0x12])();
            if (iVar4 == 1) {
              uVar6 = -(uint)((double)local_30.Chars != 0.0) & 1;
            }
            else if (iVar4 == 0) {
              uVar6 = (uint)((int)local_30.Chars != 0);
            }
            else {
              uVar6 = 0;
            }
            FxExpression::FxExpression(pFVar5,&(this->super_FxExpression).ScriptPosition);
            pFVar5->_vptr_FxExpression = (_func_int **)&PTR__FxConstant_008682d0;
            *(PInt **)(pFVar5 + 1) = TypeSInt32;
            *(undefined4 *)&pFVar5[1].JumpAddresses.Array = 0;
            pPVar3 = TypeBool;
            *(PBool **)(pFVar5 + 1) = TypeBool;
            pFVar5->ValueType = (PType *)pPVar3;
            *(uint *)&pFVar5[1].JumpAddresses.Array = uVar6;
            pFVar5->isresolved = true;
            (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
            if (pPVar2 != TypeString) {
              return pFVar5;
            }
            FString::~FString(&local_30);
            return pFVar5;
          }
          __assert_fail("basex->ValueType != TypeState && \"We shouldn\'t be able to generate a constant state ref\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_expression.cpp"
                        ,0x1ba,"virtual FxExpression *FxBoolCast::Resolve(FCompileContext &)");
        }
        pFVar7 = (FxBoolCast *)0x0;
        FScriptPosition::Message
                  (&(this->super_FxExpression).ScriptPosition,2,"Numeric type expected");
      }
      (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
      this = pFVar7;
    }
  }
  return &this->super_FxExpression;
}

Assistant:

FxExpression *FxBoolCast::Resolve(FCompileContext &ctx)
{
	CHECKRESOLVED();
	SAFE_RESOLVE(basex, ctx);

	if (basex->ValueType == TypeBool)
	{
		FxExpression *x = basex;
		basex = nullptr;
		delete this;
		return x;
	}
	else if (basex->ValueType->GetRegType() == REGT_INT || basex->ValueType->GetRegType() == REGT_FLOAT || basex->ValueType->GetRegType() == REGT_POINTER)
	{
		if (basex->isConstant())
		{
			assert(basex->ValueType != TypeState && "We shouldn't be able to generate a constant state ref");

			ExpVal constval = static_cast<FxConstant *>(basex)->GetValue();
			FxExpression *x = new FxConstant(constval.GetBool(), ScriptPosition);
			delete this;
			return x;
		}
		return this;
	}
	ScriptPosition.Message(MSG_ERROR, "Numeric type expected");
	delete this;
	return nullptr;
}